

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_bitextract
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType expected_result_type,BaseType input_type0,
          BaseType input_type1,BaseType input_type2)

{
  bool bVar1;
  SPIRType *pSVar2;
  uint32_t id;
  bool local_33d;
  spirv_cross local_300 [32];
  spirv_cross local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [8];
  string expr;
  undefined1 local_278 [40];
  string cast_op2;
  undefined1 local_230 [40];
  string cast_op1;
  undefined1 local_1f0 [8];
  string op2_expr;
  undefined1 local_1d0 [8];
  string op1_expr;
  undefined1 local_1a0 [8];
  string cast_op0;
  undefined1 local_180 [8];
  SPIRType expected_type;
  SPIRType *out_type;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)local_180,
                     (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type0;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  id = (uint32_t)this;
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type0) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1a0,id,SUB41(op0,0));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_1a0,(SPIRType *)this,(uint32_t)local_180);
  }
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1d0,id,SUB41(op1,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1f0,id,SUB41(op2,0));
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type1;
  expected_type.super_IVariant._12_4_ = 1;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op1);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type1) {
    ::std::__cxx11::string::string((string *)(local_230 + 0x20),(string *)local_1d0);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_230,(SPIRType *)this);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)(local_230 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
               (char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
               (char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::~string((string *)local_230);
  }
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type2;
  expected_type.super_IVariant._12_4_ = 1;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op2);
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type2) {
    ::std::__cxx11::string::string((string *)(local_278 + 0x20),(string *)local_1f0);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_278,(SPIRType *)this);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((spirv_cross *)(local_278 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
               (char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
               (char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::~string((string *)local_278);
  }
  ::std::__cxx11::string::string(local_2a0);
  if (*(BaseType *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) ==
      expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (local_300,&op,(char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x5fe6df,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_230 + 0x20),(char (*) [3])0x5fe6df,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_278 + 0x20),(char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator+=(local_2a0,(string *)local_300);
    ::std::__cxx11::string::~string((string *)local_300);
  }
  else {
    expected_type.super_IVariant._12_4_ =
         *(undefined4 *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4)
    ;
    expected_type.super_IVariant._vptr_IVariant._4_4_ = expected_result_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3a])
              (local_2c0,this,expected_type.member_name_cache._M_h._M_single_bucket,local_180);
    ::std::__cxx11::string::operator=(local_2a0,local_2c0);
    ::std::__cxx11::string::~string(local_2c0);
    ::std::__cxx11::string::operator+=(local_2a0,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (local_2e0,&op,(char (*) [2])0x601bd3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x5fe6df,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_230 + 0x20),(char (*) [3])0x5fe6df,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_278 + 0x20),(char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::operator+=(local_2a0,(string *)local_2e0);
    ::std::__cxx11::string::~string((string *)local_2e0);
    ::std::__cxx11::string::operator+=(local_2a0,')');
  }
  bVar1 = should_forward(this,op0);
  local_33d = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    local_33d = false;
    if (bVar1) {
      local_33d = should_forward(this,op2);
    }
  }
  emit_op(this,result_type,result_id,(string *)local_2a0,local_33d,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  ::std::__cxx11::string::~string(local_2a0);
  ::std::__cxx11::string::~string((string *)(local_278 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_230 + 0x20));
  ::std::__cxx11::string::~string((string *)local_1f0);
  ::std::__cxx11::string::~string((string *)local_1d0);
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_bitextract(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                                   uint32_t op2, const char *op,
                                                   SPIRType::BaseType expected_result_type,
                                                   SPIRType::BaseType input_type0, SPIRType::BaseType input_type1,
                                                   SPIRType::BaseType input_type2)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type0;

	string cast_op0 =
	    expression_type(op0).basetype != input_type0 ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);

	// Use value casts here instead. Input must be exactly int or uint, but SPIR-V might be 16-bit.
	expected_type.basetype = input_type1;
	expected_type.vecsize = 1;
	string cast_op1 = expression_type(op1).basetype != input_type1 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op1_expr, ")") :
	                      op1_expr;

	expected_type.basetype = input_type2;
	expected_type.vecsize = 1;
	string cast_op2 = expression_type(op2).basetype != input_type2 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op2_expr, ")") :
	                      op2_expr;

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.vecsize = out_type.vecsize;
		expected_type.basetype = expected_result_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}